

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

uint get_elf_hwcap_from_proc_self_auxv(uint type)

{
  int iVar1;
  size_t sVar2;
  int in_EDI;
  int nread;
  uint result;
  anon_struct_8_2_05f151bc entry;
  FILE *fp;
  uint local_1c;
  int local_18;
  uint local_14;
  FILE *local_10;
  int local_8;
  uint local_4;
  
  local_8 = in_EDI;
  local_10 = fopen("/proc/self/auxv","rb");
  if (local_10 == (FILE *)0x0) {
    fprintf(_stderr,"fopen /proc/self/auxv failed");
    fprintf(_stderr,"\n");
    local_4 = 0;
  }
  else {
    local_1c = 0;
    do {
      iVar1 = feof(local_10);
      if (((iVar1 != 0) || (sVar2 = fread(&local_18,8,1,local_10), (int)sVar2 != 1)) ||
         ((local_18 == 0 && (local_14 == 0)))) goto LAB_0017a340;
    } while (local_18 != local_8);
    local_1c = local_14;
LAB_0017a340:
    fclose(local_10);
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

static unsigned int get_elf_hwcap_from_proc_self_auxv(unsigned int type)
{
    FILE* fp = fopen("/proc/self/auxv", "rb");
    if (!fp)
    {
        NCNN_LOGE("fopen /proc/self/auxv failed");
        return 0;
    }

#if __aarch64__ || __mips64 || __riscv_xlen == 64 || __loongarch64
    struct
    {
        uint64_t tag;
        uint64_t value;
    } entry;
#else
    struct
    {
        unsigned int tag;
        unsigned int value;
    } entry;

#endif

    unsigned int result = 0;
    while (!feof(fp))
    {
        int nread = fread((char*)&entry, sizeof(entry), 1, fp);
        if (nread != 1)
            break;

        if (entry.tag == 0 && entry.value == 0)
            break;

        if (entry.tag == type)
        {
            result = entry.value;
            break;
        }
    }

    fclose(fp);

    return result;
}